

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperatorOverflowCheck,bool,false,false>
               (hugeint_t *ldata,hugeint_t *rdata,hugeint_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  hugeint_t left;
  hugeint_t left_00;
  hugeint_t hVar9;
  hugeint_t right;
  hugeint_t right_00;
  hugeint_t right_01;
  ulong local_60;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar4 = 8;
      do {
        hVar9.upper = *(int64_t *)((long)&ldata->lower + lVar4);
        hVar9.lower = *(uint64_t *)((long)ldata + lVar4 + -8);
        right_01.upper = *(int64_t *)((long)&rdata->lower + lVar4);
        right_01.lower = *(uint64_t *)((long)rdata + lVar4 + -8);
        hVar9 = SubtractOperatorOverflowCheck::
                Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>(hVar9,right_01);
        *(uint64_t *)((long)result_data + lVar4 + -8) = hVar9.lower;
        *(int64_t *)((long)&result_data->lower + lVar4) = hVar9.upper;
        lVar4 = lVar4 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_60 = 0;
    uVar6 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar2 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar2 = count;
        }
LAB_0108f7df:
        uVar3 = uVar6;
        if (uVar6 < uVar2) {
          uVar8 = uVar6 << 4 | 8;
          do {
            left_00.upper = *(int64_t *)((long)&ldata->lower + uVar8);
            left_00.lower = *(uint64_t *)((long)ldata + (uVar8 - 8));
            right_00.upper = *(int64_t *)((long)&rdata->lower + uVar8);
            right_00.lower = *(uint64_t *)((long)rdata + (uVar8 - 8));
            hVar9 = SubtractOperatorOverflowCheck::
                    Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                              (left_00,right_00);
            *(uint64_t *)((long)result_data + (uVar8 - 8)) = hVar9.lower;
            *(int64_t *)((long)&result_data->lower + uVar8) = hVar9.upper;
            uVar6 = uVar6 + 1;
            uVar8 = uVar8 + 0x10;
            uVar3 = uVar2;
          } while (uVar2 != uVar6);
        }
      }
      else {
        uVar8 = puVar1[local_60];
        uVar2 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar2 = count;
        }
        uVar3 = uVar2;
        if (uVar8 != 0) {
          if (uVar8 == 0xffffffffffffffff) goto LAB_0108f7df;
          uVar3 = uVar6;
          if (uVar6 < uVar2) {
            uVar5 = uVar6 << 4 | 8;
            uVar7 = 0;
            do {
              if ((uVar8 >> (uVar7 & 0x3f) & 1) != 0) {
                left.upper = *(int64_t *)((long)&ldata->lower + uVar5);
                left.lower = *(uint64_t *)((long)ldata + (uVar5 - 8));
                right.upper = *(int64_t *)((long)&rdata->lower + uVar5);
                right.lower = *(uint64_t *)((long)rdata + (uVar5 - 8));
                hVar9 = SubtractOperatorOverflowCheck::
                        Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>(left,right)
                ;
                *(uint64_t *)((long)result_data + (uVar5 - 8)) = hVar9.lower;
                *(int64_t *)((long)&result_data->lower + uVar5) = hVar9.upper;
              }
              uVar7 = uVar7 + 1;
              uVar5 = uVar5 + 0x10;
              uVar3 = uVar2;
            } while (uVar2 - uVar6 != uVar7);
          }
        }
      }
      local_60 = local_60 + 1;
      uVar6 = uVar3;
    } while (local_60 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}